

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O1

Cluster * __thiscall mkvparser::Segment::GetLast(Segment *this)

{
  Cluster *pCVar1;
  
  if ((this->m_clusters == (Cluster **)0x0) || (this->m_clusterCount < 1)) {
    pCVar1 = &this->m_eos;
  }
  else {
    pCVar1 = this->m_clusters[this->m_clusterCount + -1];
    if (pCVar1 == (Cluster *)0x0) {
      __assert_fail("pCluster",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/RainwayApp[P]libwebm/mkvparser/mkvparser.cc"
                    ,0x9d5,"const Cluster *mkvparser::Segment::GetLast() const");
    }
  }
  return pCVar1;
}

Assistant:

const Cluster* Segment::GetLast() const {
  if ((m_clusters == NULL) || (m_clusterCount <= 0))
    return &m_eos;

  const long idx = m_clusterCount - 1;

  Cluster* const pCluster = m_clusters[idx];
  assert(pCluster);

  return pCluster;
}